

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operator.cpp
# Opt level: O1

bool slang::ast::OpInfo::isRelational(BinaryOperator op)

{
  return op - GreaterThanEqual < 4;
}

Assistant:

bool OpInfo::isRelational(BinaryOperator op) {
    switch (op) {
        case BinaryOperator::GreaterThanEqual:
        case BinaryOperator::GreaterThan:
        case BinaryOperator::LessThanEqual:
        case BinaryOperator::LessThan:
            return true;
        default:
            return false;
    }
}